

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AddVerify.cpp
# Opt level: O0

void AddVerifyBase<long,unsigned_short>(char *types)

{
  bool bVar1;
  char *pcVar2;
  TestCase<long,_unsigned_short,_3> TVar3;
  string msg_2;
  long x;
  string msg_1;
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> si;
  bool fSuccess;
  string msg;
  long ret;
  TestCase<long,_unsigned_short,_3> test;
  TestVector<long,_unsigned_short,_3> tests;
  char *in_stack_fffffffffffffd68;
  allocator *in_stack_fffffffffffffd70;
  TestVector<long,_unsigned_short,_3> *in_stack_fffffffffffffd78;
  char *in_stack_fffffffffffffd80;
  long local_240;
  unsigned_short local_238;
  bool bStack_236;
  allocator local_219;
  string local_218 [13];
  undefined1 in_stack_fffffffffffffdf5;
  unsigned_short in_stack_fffffffffffffdf6;
  long in_stack_fffffffffffffdf8;
  string *in_stack_fffffffffffffe00;
  undefined1 local_1f1 [33];
  string local_1d0 [32];
  string local_1b0 [38];
  SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  local_18a;
  long local_188;
  allocator local_179;
  string local_178 [39];
  allocator local_151;
  string local_150 [32];
  string local_130 [32];
  string local_110 [32];
  SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_f0;
  byte local_e2;
  allocator local_e1;
  string local_e0 [55];
  allocator local_a9;
  string local_a8 [32];
  string local_88 [32];
  string local_68 [40];
  TestCase<long,_unsigned_short,_3> local_40;
  long local_30;
  unsigned_short local_28;
  byte local_26;
  TestVector<long,_unsigned_short,_3> local_20;
  
  TestVector<long,_unsigned_short,_3>::TestVector(&local_20);
  local_40 = TestVector<long,_unsigned_short,_3>::GetNext(in_stack_fffffffffffffd78);
  local_30 = local_40.x;
  local_28 = local_40.y;
  local_26 = local_40.fExpected;
  while( true ) {
    bVar1 = TestVector<long,_unsigned_short,_3>::Done(&local_20);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    bVar1 = SafeAdd<long,unsigned_short>
                      ((long)in_stack_fffffffffffffd70,
                       (unsigned_short)((ulong)in_stack_fffffffffffffd68 >> 0x30),(long *)0x17e89e);
    if (bVar1 != (bool)(local_26 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_a8,"Error in case ",&local_a9);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_88);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)&local_a9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_e0,pcVar2,&local_e1);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf6,
                 (bool)in_stack_fffffffffffffdf5);
      std::__cxx11::string::~string(local_e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_e1);
      std::__cxx11::string::~string(local_68);
    }
    local_e2 = 1;
    SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::SafeInt
              (&local_f0,&local_30);
    SafeInt<long,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<long,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                *)in_stack_fffffffffffffd70,
               (unsigned_short)((ulong)in_stack_fffffffffffffd68 >> 0x30));
    if ((local_e2 & 1) != (local_26 & 1)) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_150,"Error in case ",&local_151);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_130);
      std::__cxx11::string::~string(local_150);
      std::allocator<char>::~allocator((allocator<char> *)&local_151);
      in_stack_fffffffffffffd80 = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_178,in_stack_fffffffffffffd80,&local_179);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf6,
                 (bool)in_stack_fffffffffffffdf5);
      std::__cxx11::string::~string(local_178);
      std::allocator<char>::~allocator((allocator<char> *)&local_179);
      std::__cxx11::string::~string(local_110);
    }
    local_e2 = 1;
    local_188 = local_30;
    SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
    ::SafeInt(&local_18a,&local_28);
    operator+=((long *)in_stack_fffffffffffffd78,
               (SafeInt<unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                )(unsigned_short)((ulong)in_stack_fffffffffffffd80 >> 0x30));
    if ((local_e2 & 1) != (local_26 & 1)) {
      in_stack_fffffffffffffd78 = (TestVector<long,_unsigned_short,_3> *)local_1f1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_1f1 + 1),"Error in case ",(allocator *)in_stack_fffffffffffffd78);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffd78,(char *)in_stack_fffffffffffffd70);
      std::__cxx11::string::~string(local_1d0);
      std::__cxx11::string::~string((string *)(local_1f1 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_1f1);
      in_stack_fffffffffffffd68 = (char *)std::__cxx11::string::c_str();
      in_stack_fffffffffffffd70 = &local_219;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_218,in_stack_fffffffffffffd68,in_stack_fffffffffffffd70);
      err_msg<long,unsigned_short>
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf6,
                 (bool)in_stack_fffffffffffffdf5);
      std::__cxx11::string::~string(local_218);
      std::allocator<char>::~allocator((allocator<char> *)&local_219);
      std::__cxx11::string::~string(local_1b0);
    }
    TVar3 = TestVector<long,_unsigned_short,_3>::GetNext(in_stack_fffffffffffffd78);
    local_240 = TVar3.x;
    local_238 = TVar3.y;
    bStack_236 = TVar3.fExpected;
    local_30 = local_240;
    local_28 = local_238;
    local_26 = bStack_236;
  }
  return;
}

Assistant:

void AddVerifyBase(const char* types)
{
	TestVector< T, U, OpType::Add > tests;
	TestCase< T, U, OpType::Add > test = tests.GetNext();

	while (!tests.Done())
	{
		T ret;
		if (SafeAdd(test.x, test.y, ret) != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + ": ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Now test throwing version
		bool fSuccess = true;
		try
		{
			SafeInt<T> si(test.x);
			si += test.y;
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (1): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		// Also need to test the version that assigns back out
		// to a plain int, as it has different logic
		fSuccess = true;
		try
		{
			T x(test.x);
			x += SafeInt<U>(test.y);
		}
		catch (...)
		{
			fSuccess = false;
		}

		if (fSuccess != test.fExpected)
		{
			std::string msg = std::string("Error in case ") + types + " throw (2): ";
			err_msg(msg.c_str(), test.x, test.y, test.fExpected);
		}

		test = tests.GetNext();
	}
}